

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.h
# Opt level: O0

CastInstr * __thiscall
flow::IRBuilder::insert<flow::CastInstr,flow::LiteralType,flow::Value*&,std::__cxx11::string>
          (IRBuilder *this,LiteralType *args,Value **args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  Instr *pIVar1;
  unique_ptr<flow::CastInstr,_std::default_delete<flow::CastInstr>_> local_38;
  unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> local_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_2;
  Value **args_local_1;
  LiteralType *args_local;
  IRBuilder *this_local;
  
  local_28 = args_2;
  args_local_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1;
  args_local_1 = (Value **)args;
  args_local = (LiteralType *)this;
  std::make_unique<flow::CastInstr,flow::LiteralType,flow::Value*,std::__cxx11::string>
            ((LiteralType *)&local_38,(Value **)args,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
  std::unique_ptr<flow::Instr,std::default_delete<flow::Instr>>::
  unique_ptr<flow::CastInstr,std::default_delete<flow::CastInstr>,void>
            ((unique_ptr<flow::Instr,std::default_delete<flow::Instr>> *)&local_30,&local_38);
  pIVar1 = insert(this,&local_30);
  std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>::~unique_ptr(&local_30);
  std::unique_ptr<flow::CastInstr,_std::default_delete<flow::CastInstr>_>::~unique_ptr(&local_38);
  return (CastInstr *)pIVar1;
}

Assistant:

T* insert(Args&&... args) {
    return static_cast<T*>(insert(std::make_unique<T>(std::move(args)...)));
  }